

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FeatureSet * __thiscall google::protobuf::EnumOptions::_internal_mutable_features(EnumOptions *this)

{
  Arena *arena;
  FeatureSet *pFVar1;
  FeatureSet *p;
  EnumOptions *this_local;
  
  if ((this->field_0)._impl_.features_ == (FeatureSet *)0x0) {
    arena = MessageLite::GetArena((MessageLite *)this);
    pFVar1 = (FeatureSet *)Arena::DefaultConstruct<google::protobuf::FeatureSet>(arena);
    (this->field_0)._impl_.features_ = pFVar1;
  }
  return (this->field_0)._impl_.features_;
}

Assistant:

inline ::google::protobuf::FeatureSet* PROTOBUF_NONNULL EnumOptions::_internal_mutable_features() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.features_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::google::protobuf::FeatureSet>(GetArena());
    _impl_.features_ = reinterpret_cast<::google::protobuf::FeatureSet*>(p);
  }
  return _impl_.features_;
}